

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O3

int __thiscall NetworkAddress::fromBuffer(NetworkAddress *this,uint8_t *buf,size_t max_len)

{
  uint uVar1;
  IPAddress local_30;
  
  uVar1 = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < (int)uVar1) {
    IPAddress::IPAddress(&local_30,buf + uVar1);
    (this->_value)._address = local_30._address;
  }
  return uVar1;
}

Assistant:

int NetworkAddress::fromBuffer(const uint8_t *buf, size_t max_len){
    int i = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(i);
    const uint8_t* ptr = buf + i;

    // byte tempAddress[4];
    // tempAddress[0] = *ptr++;
    // tempAddress[1] = *ptr++;
    // tempAddress[2] = *ptr++;
    // tempAddress[3] = *ptr++;

    _value = IPAddress(ptr);
    return ptr - buf;
}